

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O0

void slang::ast::ParameterSymbolBase::fromLocalSyntax
               (Scope *scope,ParameterDeclarationStatementSyntax *syntax,
               SmallVectorBase<slang::ast::Symbol_*> *results)

{
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_01;
  ParameterDeclarationBaseSyntax *pPVar1;
  ParameterDeclarationSyntax *pPVar2;
  iterator ppPVar3;
  TypeParameterDeclarationSyntax *this;
  iterator ppTVar4;
  iterator ppTVar5;
  long in_RSI;
  Symbol *in_RDI;
  TypeParameterSymbol *local_res70;
  iterator __end3_1;
  iterator __begin3_1;
  SmallVector<slang::ast::TypeParameterSymbol_*,_5UL> *__range3_1;
  SmallVector<slang::ast::TypeParameterSymbol_*,_5UL> params_1;
  ParameterSymbol *param;
  iterator __end3;
  iterator __begin3;
  SmallVector<slang::ast::ParameterSymbol_*,_5UL> *__range3;
  SmallVector<slang::ast::ParameterSymbol_*,_5UL> params;
  not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> paramBase;
  Symbol **in_stack_fffffffffffffe88;
  SmallVectorBase<slang::ast::Symbol_*> *in_stack_fffffffffffffe90;
  TypeParameterSymbol *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_fffffffffffffe98;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
  *in_stack_fffffffffffffea0;
  Scope *in_stack_fffffffffffffeb8;
  ParameterSymbol *scope_00;
  Symbol *in_stack_fffffffffffffec0;
  Symbol *this_01;
  pointer in_stack_fffffffffffffec8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffed0;
  __extent_storage<18446744073709551615UL> _Var6;
  SmallVectorBase<slang::ast::ParameterSymbol_*> *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff10;
  undefined2 uVar7;
  SmallVectorBase<slang::ast::TypeParameterSymbol_*> *this_02;
  ParameterDeclarationSyntax *in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff26;
  undefined1 in_stack_ffffffffffffff27;
  TypeParameterDeclarationSyntax *in_stack_ffffffffffffff28;
  char in_stack_ffffffffffffff30 [8];
  iterator local_80;
  SmallVectorBase<slang::ast::ParameterSymbol_*> local_60 [2];
  undefined8 local_20;
  Symbol *local_8;
  
  uVar7 = (undefined2)((ulong)in_stack_ffffffffffffff10 >> 0x30);
  local_20 = *(undefined8 *)(in_RSI + 0x50);
  local_8 = in_RDI;
  pPVar1 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator->
                     ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)0x49f6c0);
  if ((pPVar1->super_SyntaxNode).kind == ParameterDeclaration) {
    SmallVector<slang::ast::ParameterSymbol_*,_5UL>::SmallVector
              ((SmallVector<slang::ast::ParameterSymbol_*,_5UL> *)0x49f6d9);
    _Var6._M_extent_value = (size_t)local_8;
    pPVar1 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator->
                       ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)0x49f6f3);
    pPVar2 = slang::syntax::SyntaxNode::as<slang::syntax::ParameterDeclarationSyntax>
                       (&pPVar1->super_SyntaxNode);
    ParameterSymbol::fromSyntax
              ((Scope *)CONCAT17(in_stack_ffffffffffffff27,
                                 CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)),
               in_stack_ffffffffffffff18,SUB21((ushort)uVar7 >> 8,0),SUB21(uVar7,0),
               in_stack_ffffffffffffff08);
    local_80 = SmallVectorBase<slang::ast::ParameterSymbol_*>::begin(local_60);
    ppPVar3 = SmallVectorBase<slang::ast::ParameterSymbol_*>::end(local_60);
    for (; local_80 != ppPVar3; local_80 = local_80 + 1) {
      scope_00 = *local_80;
      this_01 = local_8;
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      syntax_00._M_extent._M_extent_value = _Var6._M_extent_value;
      syntax_00._M_ptr = (pointer)pPVar2;
      Symbol::setAttributes(this_01,(Scope *)scope_00,syntax_00);
      SmallVectorBase<slang::ast::Symbol_*>::push_back
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    }
    SmallVector<slang::ast::ParameterSymbol_*,_5UL>::~SmallVector
              ((SmallVector<slang::ast::ParameterSymbol_*,_5UL> *)0x49f857);
  }
  else {
    SmallVector<slang::ast::TypeParameterSymbol_*,_5UL>::SmallVector
              ((SmallVector<slang::ast::TypeParameterSymbol_*,_5UL> *)0x49f869);
    pPVar1 = not_null<slang::syntax::ParameterDeclarationBaseSyntax_*>::operator->
                       ((not_null<slang::syntax::ParameterDeclarationBaseSyntax_*> *)0x49f883);
    this = slang::syntax::SyntaxNode::as<slang::syntax::TypeParameterDeclarationSyntax>
                     (&pPVar1->super_SyntaxNode);
    TypeParameterSymbol::fromSyntax
              ((Scope *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
               (bool)in_stack_ffffffffffffff27,(bool)in_stack_ffffffffffffff26,
               (SmallVectorBase<slang::ast::TypeParameterSymbol_*> *)in_stack_ffffffffffffff18);
    this_02 = (SmallVectorBase<slang::ast::TypeParameterSymbol_*> *)&stack0xffffffffffffff18;
    ppTVar4 = SmallVectorBase<slang::ast::TypeParameterSymbol_*>::begin(this_02);
    ppTVar5 = SmallVectorBase<slang::ast::TypeParameterSymbol_*>::end(this_02);
    for (; ppTVar4 != ppTVar5; ppTVar4 = ppTVar4 + 1) {
      this_00 = *ppTVar4;
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<const_slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)this,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_8);
      syntax_01._M_extent._M_extent_value = in_stack_fffffffffffffed0._M_extent_value;
      syntax_01._M_ptr = in_stack_fffffffffffffec8;
      Symbol::setAttributes(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,syntax_01);
      SmallVectorBase<slang::ast::Symbol_*>::push_back
                ((SmallVectorBase<slang::ast::Symbol_*> *)this_00,in_stack_fffffffffffffe88);
    }
    SmallVector<slang::ast::TypeParameterSymbol_*,_5UL>::~SmallVector
              ((SmallVector<slang::ast::TypeParameterSymbol_*,_5UL> *)0x49f9c6);
  }
  return;
}

Assistant:

void ParameterSymbolBase::fromLocalSyntax(const Scope& scope,
                                          const ParameterDeclarationStatementSyntax& syntax,
                                          SmallVectorBase<Symbol*>& results) {
    auto paramBase = syntax.parameter;
    if (paramBase->kind == SyntaxKind::ParameterDeclaration) {
        SmallVector<ParameterSymbol*> params;
        ParameterSymbol::fromSyntax(scope, paramBase->as<ParameterDeclarationSyntax>(),
                                    /* isLocal */ true, /* isPort */ false, params);
        for (auto param : params) {
            param->setAttributes(scope, syntax.attributes);
            results.push_back(param);
        }
    }
    else {
        SmallVector<TypeParameterSymbol*> params;
        TypeParameterSymbol::fromSyntax(scope, paramBase->as<TypeParameterDeclarationSyntax>(),
                                        /* isLocal */ true, /* isPort */ false, params);
        for (auto param : params) {
            param->setAttributes(scope, syntax.attributes);
            results.push_back(param);
        }
    }
}